

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# yacclab_tensor.h
# Opt level: O2

unique_ptr<YacclabTensorOutput,_std::default_delete<YacclabTensorOutput>_> __thiscall
YacclabTensorOutput2D::Copy(YacclabTensorOutput2D *this)

{
  _func_int **in_RAX;
  _func_int **local_18;
  
  local_18 = in_RAX;
  std::make_unique<YacclabTensorOutput2D,cv::Mat_<int>const&>((Mat_<int> *)&local_18);
  (this->super_YacclabTensorOutput).super_YacclabTensor._vptr_YacclabTensor = local_18;
  return (__uniq_ptr_data<YacclabTensorOutput,_std::default_delete<YacclabTensorOutput>,_true,_true>
         )(__uniq_ptr_data<YacclabTensorOutput,_std::default_delete<YacclabTensorOutput>,_true,_true>
           )this;
}

Assistant:

virtual std::unique_ptr<YacclabTensorOutput> Copy() const override {  return std::make_unique<YacclabTensorOutput2D>(mat_);  }